

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O2

ExprBase * EvaluateBinaryOp(ExpressionEvalContext *ctx,ExprBinaryOp *expression)

{
  Allocator *pAVar1;
  SynBase *pSVar2;
  TypeBase *pTVar3;
  bool bVar4;
  int iVar5;
  StackFrame **ppSVar6;
  undefined4 extraout_var;
  ExprBase *pEVar7;
  
  if (((ctx->stackFrames).count != 0) &&
     (ppSVar6 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::back(&ctx->stackFrames),
     (*ppSVar6)->targetYield != 0)) {
    pAVar1 = ctx->ctx->allocator;
    iVar5 = (*pAVar1->_vptr_Allocator[2])(pAVar1,0x30);
    pEVar7 = (ExprBase *)CONCAT44(extraout_var,iVar5);
    pSVar2 = (expression->super_ExprBase).source;
    pTVar3 = ctx->ctx->typeVoid;
    pEVar7->typeID = 2;
    pEVar7->source = pSVar2;
    pEVar7->type = pTVar3;
    pEVar7->next = (ExprBase *)0x0;
    pEVar7->listed = false;
    pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3b40;
    return pEVar7;
  }
  bVar4 = AddInstruction(ctx);
  if (((bVar4) && (pEVar7 = Evaluate(ctx,expression->lhs), pEVar7 != (ExprBase *)0x0)) &&
     (pEVar7 = CreateBinaryOp(ctx,(expression->super_ExprBase).source,pEVar7,expression->rhs,
                              *(SynBinaryOpType *)&(expression->super_ExprBase).field_0x2c),
     pEVar7 != (ExprBase *)0x0)) {
    pEVar7 = CheckType(&expression->super_ExprBase,pEVar7);
    return pEVar7;
  }
  return (ExprBase *)0x0;
}

Assistant:

ExprBase* EvaluateBinaryOp(ExpressionEvalContext &ctx, ExprBinaryOp *expression)
{
	if(!ctx.stackFrames.empty() && ctx.stackFrames.back()->targetYield)
		return new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	if(!AddInstruction(ctx))
		return NULL;

	ExprBase *lhs = Evaluate(ctx, expression->lhs);

	if(!lhs)
		return NULL;

	// rhs remain unevaluated
	ExprBase *result = CreateBinaryOp(ctx, expression->source, lhs, expression->rhs, expression->op);

	if(!result)
		return result;

	return CheckType(expression, result);
}